

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::subDualActivity
          (SPxLPBase<double> *this,VectorBase<double> *dual,VectorBase<double> *activity)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  double *pdVar4;
  string *in_RDX;
  int r;
  string *in_stack_ffffffffffffff38;
  SPxLPBase<double> *in_stack_ffffffffffffff40;
  SVectorBase<double> *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  allocator *paVar5;
  undefined4 in_stack_ffffffffffffff60;
  int local_78;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  
  local_18 = in_RDX;
  iVar1 = VectorBase<double>::dim((VectorBase<double> *)0x241899);
  iVar2 = nRows((SPxLPBase<double> *)0x2418a7);
  if (iVar1 != iVar2) {
    local_4d = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"XSPXLP02 Dual vector for computing dual activity has wrong dimension",
               &local_39);
    SPxInternalCodeException::SPxInternalCodeException
              ((SPxInternalCodeException *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_4d = 0;
    __cxa_throw(uVar3,&SPxInternalCodeException::typeinfo,
                SPxInternalCodeException::~SPxInternalCodeException);
  }
  iVar1 = VectorBase<double>::dim((VectorBase<double> *)0x24198f);
  iVar2 = nCols((SPxLPBase<double> *)0x24199d);
  if (iVar1 == iVar2) {
    for (local_78 = 0; iVar2 = nRows((SPxLPBase<double> *)0x241a83), local_78 < iVar2;
        local_78 = local_78 + 1) {
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff40,
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      if ((*pdVar4 != 0.0) || (NAN(*pdVar4))) {
        in_stack_ffffffffffffff38 = local_18;
        in_stack_ffffffffffffff40 =
             (SPxLPBase<double> *)
             VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff40,
                        (int)((ulong)local_18 >> 0x20));
        rowVector(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        VectorBase<double>::multSub<double,double>
                  ((VectorBase<double> *)CONCAT44(iVar1,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      }
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  paVar5 = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,"XSPXLP04 Activity vector computing dual activity has wrong dimension",paVar5)
  ;
  SPxInternalCodeException::SPxInternalCodeException
            ((SPxInternalCodeException *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  __cxa_throw(uVar3,&SPxInternalCodeException::typeinfo,
              SPxInternalCodeException::~SPxInternalCodeException);
}

Assistant:

virtual void subDualActivity(const VectorBase<R>& dual, VectorBase<R>& activity) const
   {
      if(dual.dim() != nRows())
      {
         throw SPxInternalCodeException("XSPXLP02 Dual vector for computing dual activity has wrong dimension");
      }

      if(activity.dim() != nCols())
      {
         throw SPxInternalCodeException("XSPXLP04 Activity vector computing dual activity has wrong dimension");
      }

      for(int r = 0; r < nRows(); r++)
      {
         if(dual[r] != 0)
            activity.multSub(dual[r], rowVector(r));
      }
   }